

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O0

wchar_t uriHexToLetterExW(uint value,UriBool uppercase)

{
  UriBool uppercase_local;
  uint value_local;
  
  switch(value) {
  case 0:
    uppercase_local = 0x30;
    break;
  case 1:
    uppercase_local = 0x31;
    break;
  case 2:
    uppercase_local = 0x32;
    break;
  case 3:
    uppercase_local = 0x33;
    break;
  case 4:
    uppercase_local = 0x34;
    break;
  case 5:
    uppercase_local = 0x35;
    break;
  case 6:
    uppercase_local = 0x36;
    break;
  case 7:
    uppercase_local = 0x37;
    break;
  case 8:
    uppercase_local = 0x38;
    break;
  case 9:
    uppercase_local = 0x39;
    break;
  case 10:
    uppercase_local = 0x61;
    if (uppercase == 1) {
      uppercase_local = 0x41;
    }
    break;
  case 0xb:
    uppercase_local = 0x62;
    if (uppercase == 1) {
      uppercase_local = 0x42;
    }
    break;
  case 0xc:
    uppercase_local = 99;
    if (uppercase == 1) {
      uppercase_local = 0x43;
    }
    break;
  case 0xd:
    uppercase_local = 100;
    if (uppercase == 1) {
      uppercase_local = 0x44;
    }
    break;
  case 0xe:
    uppercase_local = 0x65;
    if (uppercase == 1) {
      uppercase_local = 0x45;
    }
    break;
  default:
    uppercase_local = 0x66;
    if (uppercase == 1) {
      uppercase_local = 0x46;
    }
  }
  return uppercase_local;
}

Assistant:

URI_CHAR URI_FUNC(HexToLetterEx)(unsigned int value, UriBool uppercase) {
	switch (value) {
	case  0: return _UT('0');
	case  1: return _UT('1');
	case  2: return _UT('2');
	case  3: return _UT('3');
	case  4: return _UT('4');
	case  5: return _UT('5');
	case  6: return _UT('6');
	case  7: return _UT('7');
	case  8: return _UT('8');
	case  9: return _UT('9');

	case 10: return (uppercase == URI_TRUE) ? _UT('A') : _UT('a');
	case 11: return (uppercase == URI_TRUE) ? _UT('B') : _UT('b');
	case 12: return (uppercase == URI_TRUE) ? _UT('C') : _UT('c');
	case 13: return (uppercase == URI_TRUE) ? _UT('D') : _UT('d');
	case 14: return (uppercase == URI_TRUE) ? _UT('E') : _UT('e');
	default: return (uppercase == URI_TRUE) ? _UT('F') : _UT('f');
	}
}